

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O1

void __thiscall
flow_cutter::DistanceAwareCutter::
DistanceAwareCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>>
          (DistanceAwareCutter *this,
          Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
          *graph)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  
  BasicCutter::
  BasicCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>>
            (&this->cutter,graph);
  iVar1 = (graph->tail).original_node_count;
  iVar5 = iVar1 * 2;
  this->node_dist[0].preimage_count_ = iVar5;
  if ((long)iVar1 == 0) {
    this->node_dist[0].data_ = (int *)0x0;
    this->node_dist[1].preimage_count_ = iVar5;
  }
  else {
    uVar4 = 0xffffffffffffffff;
    if (-1 < iVar1) {
      uVar4 = (long)iVar1 << 3;
    }
    piVar2 = (int *)operator_new__(uVar4);
    this->node_dist[0].data_ = piVar2;
    this->node_dist[1].preimage_count_ = iVar5;
    if (iVar1 != 0) {
      uVar4 = 0xffffffffffffffff;
      if (-1 < iVar1) {
        uVar4 = (long)iVar5 << 2;
      }
      piVar2 = (int *)operator_new__(uVar4);
      goto LAB_0012d824;
    }
  }
  piVar2 = (int *)0x0;
LAB_0012d824:
  this->node_dist[1].data_ = piVar2;
  (this->rng)._M_x[0] = 0x1571;
  uVar4 = 0x1571;
  lVar3 = 0x28;
  do {
    uVar4 = (ulong)((((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar3) - 0x27);
    *(ulong *)(&(this->cutter).assimilated[0].node_set.node_count_inside_ + lVar3 * 2) = uVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x297);
  (this->rng)._M_p = 0x270;
  return;
}

Assistant:

DistanceAwareCutter(const Graph& graph)
        : cutter(graph)
        , node_dist { ArrayIDFunc<int> { graph.node_count() },
            ArrayIDFunc<int> { graph.node_count() } }
    {
    }